

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O2

void __thiscall
OpenMD::SimCreator::loadCoordinates(SimCreator *this,SimInfo *info,string *mdFileName)

{
  int iVar1;
  DumpReader reader;
  DumpReader local_1270;
  
  DumpReader::DumpReader(&local_1270,info,mdFileName);
  iVar1 = DumpReader::getNFrames(&local_1270);
  if (iVar1 < 1) {
    snprintf(painCave.errMsg,2000,
             "Initial configuration file %s should at least contain one frame\n",
             (mdFileName->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    DumpReader::readFrame(&local_1270,iVar1 + -1);
  }
  (*info->sman_->_vptr_SnapshotManager[2])();
  DumpReader::~DumpReader(&local_1270);
  return;
}

Assistant:

void SimCreator::loadCoordinates(SimInfo* info,
                                   const std::string& mdFileName) {
    DumpReader reader(info, mdFileName);
    int nframes = reader.getNFrames();

    if (nframes > 0) {
      reader.readFrame(nframes - 1);
    } else {
      // invalid initial coordinate file
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Initial configuration file %s should at least contain one frame\n",
          mdFileName.c_str());
      painCave.isFatal = 1;
      simError();
    }
    // copy the current snapshot to previous snapshot
    info->getSnapshotManager()->advance();
  }